

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLDConfigLDConfigTool.cxx
# Opt level: O3

bool __thiscall
cmLDConfigLDConfigTool::GetLDConfigPaths
          (cmLDConfigLDConfigTool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer pcVar1;
  pointer pcVar2;
  cmRuntimeDependencyArchive *pcVar3;
  cmLDConfigLDConfigTool *pcVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  cmMakefile *this_00;
  string *psVar8;
  cmUVProcessChainBuilder *this_01;
  istream *piVar9;
  long lVar10;
  char **ppcVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  cmUVProcessChain process;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  string line;
  string ldConfigPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ldConfigCommand;
  RegularExpressionMatch match;
  cmUVProcessChainBuilder builder;
  undefined1 local_1a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [17];
  undefined7 uStack_167;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  undefined1 local_118 [32];
  char *local_f8 [2];
  char local_e8 [16];
  char **local_d8 [2];
  char *local_c8 [10];
  char *local_78;
  cmLDConfigLDConfigTool *local_70;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  undefined1 local_60 [24];
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  local_48;
  
  local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paths;
  this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmLDConfigTool).Archive);
  pcVar1 = local_118 + 0x10;
  local_118._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"CMAKE_LDCONFIG_COMMAND","");
  psVar8 = cmMakefile::GetSafeDefinition(this_00,(string *)local_118);
  local_158._M_allocated_capacity = (size_type)&local_148;
  pcVar2 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar2,pcVar2 + psVar8->_M_string_length);
  if ((pointer)local_118._0_8_ != pcVar1) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if (local_158._8_8_ == 0) {
    local_118._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"/sbin","");
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"/usr/sbin","");
    ppcVar11 = local_c8;
    local_d8[0] = ppcVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"/usr/local/sbin","");
    __l._M_len = 3;
    __l._M_array = (iterator)local_118;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_178,__l,(allocator_type *)(local_1a0 + 8));
    cmsys::SystemTools::FindProgram
              ((string *)local_60,"ldconfig",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178,false);
    std::__cxx11::string::operator=((string *)local_158._M_local_buf,(string *)local_60);
    if (local_60._0_8_ != (long)local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_178);
    lVar10 = -0x60;
    do {
      if (ppcVar11 != (char **)ppcVar11[-2]) {
        operator_delete(ppcVar11[-2],(ulong)(*ppcVar11 + 1));
      }
      ppcVar11 = ppcVar11 + -4;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0);
    if (local_158._8_8_ == 0) {
      pcVar3 = (this->super_cmLDConfigTool).Archive;
      local_118._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"Could not find ldconfig","");
      cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_118);
      if ((pointer)local_118._0_8_ != pcVar1) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      bVar5 = false;
      goto LAB_003c5dc3;
    }
  }
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument((string *)&local_158,&local_138,false);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
             (char (*) [3])"-v");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
             (char (*) [3])"-N");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_138,
             (char (*) [3])"-X");
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_60);
  this_01 = cmUVProcessChainBuilder::SetBuiltinStream
                      ((cmUVProcessChainBuilder *)local_60,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand(this_01,&local_138);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_1a0);
  bVar5 = cmUVProcessChain::Valid((cmUVProcessChain *)local_1a0);
  if (bVar5) {
    local_178._0_8_ = local_178 + 0x10;
    local_178._8_8_ = (pointer)0x0;
    local_178[0x10] = 0;
    local_70 = this;
    if ((GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::
         regex == '\0') &&
       (iVar7 = __cxa_guard_acquire(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::regex), iVar7 != 0)) {
      GetLDConfigPaths::regex.regmatch.startp[0] = (char *)0x0;
      GetLDConfigPaths::regex.regmatch.endp[0] = (char *)0x0;
      GetLDConfigPaths::regex.regmatch.searchstring = (char *)0x0;
      GetLDConfigPaths::regex.program = (char *)0x0;
      cmsys::RegularExpression::compile(&GetLDConfigPaths::regex,"^([^\t:]*):");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetLDConfigPaths::regex,
                   &__dso_handle);
      __cxa_guard_release(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::regex);
    }
    while( true ) {
      piVar9 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_1a0);
      cVar6 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar9 + -0x18) + (char)piVar9);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (piVar9,(string *)local_178,cVar6);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
      local_118._0_8_ = (pointer)0x0;
      local_c8[0] = (char *)0x0;
      local_78 = (char *)0x0;
      bVar5 = cmsys::RegularExpression::find
                        (&GetLDConfigPaths::regex,(char *)local_178._0_8_,
                         (RegularExpressionMatch *)local_118);
      if (bVar5) {
        if ((char *)local_118._8_8_ == (char *)0x0) {
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          local_198._M_string_length._0_4_ = None;
          local_198._M_string_length._4_4_ = 0;
          local_198.field_2._M_local_buf[0] = '\0';
        }
        else {
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(local_1a0 + 8),local_118._8_8_,local_c8[1]);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_1a0 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,
                          CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                   local_198.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    bVar5 = cmUVProcessChain::Wait((cmUVProcessChain *)local_1a0,-1);
    pcVar4 = local_70;
    pcVar1 = local_118 + 0x10;
    if (bVar5) {
      cmUVProcessChain::GetStatus
                ((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  *)(local_1a0 + 8),(cmUVProcessChain *)local_1a0);
      if ((*(long **)local_198._M_dataplus._M_p == (long *)0x0) ||
         (**(long **)local_198._M_dataplus._M_p != 0)) {
        pcVar3 = (pcVar4->super_cmLDConfigTool).Archive;
        local_118._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_118,"Failed to run ldconfig","");
        cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_118);
        if ((pointer)local_118._0_8_ != pcVar1) {
          operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
        }
        bVar5 = false;
        if ((StdioConfiguration)local_198._M_dataplus._M_p == (StdioConfiguration)0x0)
        goto LAB_003c5d86;
      }
      else {
        bVar5 = true;
      }
      operator_delete(local_198._M_dataplus._M_p,
                      CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                               local_198.field_2._M_local_buf[0]) - (long)local_198._M_dataplus._M_p
                     );
    }
    else {
      pcVar3 = (local_70->super_cmLDConfigTool).Archive;
      local_118._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_118,"Failed to wait on ldconfig process","");
      cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_118);
      if ((pointer)local_118._0_8_ != pcVar1) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
      }
      bVar5 = false;
    }
LAB_003c5d86:
    if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
      operator_delete((void *)local_178._0_8_,CONCAT71(uStack_167,local_178[0x10]) + 1);
    }
  }
  else {
    pcVar3 = (this->super_cmLDConfigTool).Archive;
    local_118._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_118,"Failed to start ldconfig process","");
    cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_118);
    if ((pointer)local_118._0_8_ != pcVar1) {
      operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    }
    bVar5 = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_1a0);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
LAB_003c5dc3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_allocated_capacity != &local_148) {
    operator_delete((void *)local_158._M_allocated_capacity,local_148._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmLDConfigLDConfigTool::GetLDConfigPaths(std::vector<std::string>& paths)
{
  std::string ldConfigPath =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_COMMAND");
  if (ldConfigPath.empty()) {
    ldConfigPath = cmSystemTools::FindProgram(
      "ldconfig", { "/sbin", "/usr/sbin", "/usr/local/sbin" });
    if (ldConfigPath.empty()) {
      this->Archive->SetError("Could not find ldconfig");
      return false;
    }
  }

  std::vector<std::string> ldConfigCommand;
  cmSystemTools::ExpandListArgument(ldConfigPath, ldConfigCommand);
  ldConfigCommand.emplace_back("-v");
  ldConfigCommand.emplace_back("-N"); // Don't rebuild the cache.
  ldConfigCommand.emplace_back("-X"); // Don't update links.

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(ldConfigCommand);
  auto process = builder.Start();
  if (!process.Valid()) {
    this->Archive->SetError("Failed to start ldconfig process");
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex("^([^\t:]*):");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      paths.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    this->Archive->SetError("Failed to wait on ldconfig process");
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    this->Archive->SetError("Failed to run ldconfig");
    return false;
  }

  return true;
}